

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::entered4(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxId param_1,int n)

{
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  Item *pIVar5;
  Real RVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  pointer pnVar11;
  uint *puVar12;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar13;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar14;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  uint uVar21;
  undefined1 uVar22;
  long in_FS_OFFSET;
  byte bVar23;
  fpclass_type fVar24;
  int32_t iVar25;
  cpp_dec_float<200U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  xi_ip;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  xi_p;
  cpp_dec_float<200U,_int,_void> local_498;
  cpp_dec_float<200U,_int,_void> *local_410;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_408;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_400;
  pointer local_3f8;
  ulong local_3f0;
  cpp_dec_float<200U,_int,_void> local_3e8;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_360;
  undefined1 local_358 [136];
  undefined8 uStack_2d0;
  double local_2c0;
  pointer local_2b8;
  pointer local_2b0;
  cpp_dec_float<200U,_int,_void> local_2a8;
  undefined1 local_228 [120];
  pointer local_1b0;
  cpp_dec_float<200U,_int,_void> local_1a8;
  cpp_dec_float<200U,_int,_void> local_128;
  uint local_a0 [28];
  
  bVar23 = 0;
  if (-1 < n) {
    pSVar2 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (n < (pSVar2->thecovectors->set).thenum) {
      local_1a8.fpclass = cpp_dec_float_finite;
      local_1a8.prec_elem = 0x1c;
      local_1a8.data._M_elems[0] = 0;
      local_1a8.data._M_elems[1] = 0;
      local_1a8.data._M_elems[2] = 0;
      local_1a8.data._M_elems[3] = 0;
      local_1a8.data._M_elems[4] = 0;
      local_1a8.data._M_elems[5] = 0;
      local_1a8.data._M_elems[6] = 0;
      local_1a8.data._M_elems[7] = 0;
      local_1a8.data._M_elems[8] = 0;
      local_1a8.data._M_elems[9] = 0;
      local_1a8.data._M_elems[10] = 0;
      local_1a8.data._M_elems[0xb] = 0;
      local_1a8.data._M_elems[0xc] = 0;
      local_1a8.data._M_elems[0xd] = 0;
      local_1a8.data._M_elems[0xe] = 0;
      local_1a8.data._M_elems[0xf] = 0;
      local_1a8.data._M_elems[0x10] = 0;
      local_1a8.data._M_elems[0x11] = 0;
      local_1a8.data._M_elems[0x12] = 0;
      local_1a8.data._M_elems[0x13] = 0;
      local_1a8.data._M_elems[0x14] = 0;
      local_1a8.data._M_elems[0x15] = 0;
      local_1a8.data._M_elems[0x16] = 0;
      local_1a8.data._M_elems[0x17] = 0;
      local_1a8.data._M_elems[0x18] = 0;
      local_1a8.data._M_elems[0x19] = 0;
      local_1a8.data._M_elems._104_5_ = 0;
      local_1a8.data._M_elems[0x1b]._1_3_ = 0;
      local_1a8.exp = 0;
      local_1a8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_1a8,
                 1.0 / (double)(pSVar2->
                               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).iterCount + 2.0);
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      local_3f8 = (this->workVec).
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_358._128_8_ =
           (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_2b0 = (pSVar2->weights).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pUVar13 = pSVar2->theCoPvec;
      local_360 = pSVar2->thePvec;
      local_2b8 = (local_360->thedelta).
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_408 = (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)(pUVar13->thedelta).
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pnVar3 = (pSVar2->theFvec->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar11 = pnVar3 + (uint)n;
      pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)local_358;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pNVar16->val).m_backend.data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar23 * -2 + 1) * 4);
        pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar16 + (ulong)bVar23 * -8 + 4);
      }
      local_358._112_4_ = pnVar3[(uint)n].m_backend.exp;
      local_358[0x74] = pnVar3[(uint)n].m_backend.neg;
      local_358._120_4_ = pnVar3[(uint)n].m_backend.fpclass;
      local_358._124_4_ = pnVar3[(uint)n].m_backend.prec_elem;
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x1c;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems[0xe] = 0;
      local_128.data._M_elems[0xf] = 0;
      local_128.data._M_elems[0x10] = 0;
      local_128.data._M_elems[0x11] = 0;
      local_128.data._M_elems[0x12] = 0;
      local_128.data._M_elems[0x13] = 0;
      local_128.data._M_elems[0x14] = 0;
      local_128.data._M_elems[0x15] = 0;
      local_128.data._M_elems[0x16] = 0;
      local_128.data._M_elems[0x17] = 0;
      local_128.data._M_elems[0x18] = 0;
      local_128.data._M_elems[0x19] = 0;
      local_128.data._M_elems._104_5_ = 0;
      local_128.data._M_elems[0x1b]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_498,1,(type *)0x0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_128,&local_498,(cpp_dec_float<200U,_int,_void> *)local_358);
      local_2a8.fpclass = cpp_dec_float_finite;
      local_2a8.prec_elem = 0x1c;
      local_2a8.data._M_elems[0] = 0;
      local_2a8.data._M_elems[1] = 0;
      local_2a8.data._M_elems[2] = 0;
      local_2a8.data._M_elems[3] = 0;
      local_2a8.data._M_elems[4] = 0;
      local_2a8.data._M_elems[5] = 0;
      local_2a8.data._M_elems[6] = 0;
      local_2a8.data._M_elems[7] = 0;
      local_2a8.data._M_elems[8] = 0;
      local_2a8.data._M_elems[9] = 0;
      local_2a8.data._M_elems[10] = 0;
      local_2a8.data._M_elems[0xb] = 0;
      local_2a8.data._M_elems[0xc] = 0;
      local_2a8.data._M_elems[0xd] = 0;
      local_2a8.data._M_elems[0xe] = 0;
      local_2a8.data._M_elems[0xf] = 0;
      local_2a8.data._M_elems[0x10] = 0;
      local_2a8.data._M_elems[0x11] = 0;
      local_2a8.data._M_elems[0x12] = 0;
      local_2a8.data._M_elems[0x13] = 0;
      local_2a8.data._M_elems[0x14] = 0;
      local_2a8.data._M_elems[0x15] = 0;
      local_2a8.data._M_elems[0x16] = 0;
      local_2a8.data._M_elems[0x17] = 0;
      local_2a8.data._M_elems[0x18] = 0;
      local_2a8.data._M_elems[0x19] = 0;
      local_2a8.data._M_elems._104_5_ = 0;
      local_2a8.data._M_elems[0x1b]._1_3_ = 0;
      local_2a8.exp = 0;
      local_2a8.neg = false;
      local_400 = pUVar13;
      lVar9 = (long)(pUVar13->thedelta).super_IdxSet.num;
      if (0 < lVar9) {
        pcVar15 = &(this->pi_p).m_backend;
        local_2c0 = *(double *)(in_FS_OFFSET + -8);
        local_3f0 = lVar9 + 1;
        local_410 = pcVar15;
        do {
          iVar8 = (local_400->thedelta).super_IdxSet.idx[local_3f0 - 2];
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)local_408 + (long)iVar8 * 0x80);
          local_498.fpclass = cpp_dec_float_finite;
          local_498.prec_elem = 0x1c;
          local_498.data._M_elems[0] = 0;
          local_498.data._M_elems[1] = 0;
          local_498.data._M_elems[2] = 0;
          local_498.data._M_elems[3] = 0;
          local_498.data._M_elems[4] = 0;
          local_498.data._M_elems[5] = 0;
          local_498.data._M_elems[6] = 0;
          local_498.data._M_elems[7] = 0;
          local_498.data._M_elems[8] = 0;
          local_498.data._M_elems[9] = 0;
          local_498.data._M_elems[10] = 0;
          local_498.data._M_elems[0xb] = 0;
          local_498.data._M_elems[0xc] = 0;
          local_498.data._M_elems[0xd] = 0;
          local_498.data._M_elems[0xe] = 0;
          local_498.data._M_elems[0xf] = 0;
          local_498.data._M_elems[0x10] = 0;
          local_498.data._M_elems[0x11] = 0;
          local_498.data._M_elems[0x12] = 0;
          local_498.data._M_elems[0x13] = 0;
          local_498.data._M_elems[0x14] = 0;
          local_498.data._M_elems[0x15] = 0;
          local_498.data._M_elems[0x16] = 0;
          local_498.data._M_elems[0x17] = 0;
          local_498.data._M_elems[0x18] = 0;
          local_498.data._M_elems[0x19] = 0;
          local_498.data._M_elems._104_5_ = 0;
          local_498.data._M_elems[0x1b]._1_3_ = 0;
          local_498.exp = 0;
          local_498.neg = false;
          pcVar17 = &local_128;
          if (&local_498 != pcVar20) {
            pcVar18 = &local_498;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              *(uint *)pcVar18 = (pcVar17->data)._M_elems[0];
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar18 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_498.exp = local_128.exp;
            local_498.neg = local_128.neg;
            local_498.fpclass = local_128.fpclass;
            local_498.prec_elem = local_128.prec_elem;
            pcVar17 = pcVar20;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_498,pcVar17);
          pcVar17 = &local_498;
          pcVar20 = &local_2a8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar20->data)._M_elems[0] = *(uint *)pcVar17;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar17 + ((ulong)bVar23 * -2 + 1) * 4);
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar23 * -8 + 4);
          }
          local_2a8.exp = local_498.exp;
          local_2a8.neg = local_498.neg;
          local_2a8.fpclass = local_498.fpclass;
          local_2a8.prec_elem = local_498.prec_elem;
          local_3e8.fpclass = cpp_dec_float_finite;
          local_3e8.prec_elem = 0x1c;
          local_3e8.data._M_elems[0] = 0;
          local_3e8.data._M_elems[1] = 0;
          local_3e8.data._M_elems[2] = 0;
          local_3e8.data._M_elems[3] = 0;
          local_3e8.data._M_elems[4] = 0;
          local_3e8.data._M_elems[5] = 0;
          local_3e8.data._M_elems[6] = 0;
          local_3e8.data._M_elems[7] = 0;
          local_3e8.data._M_elems[8] = 0;
          local_3e8.data._M_elems[9] = 0;
          local_3e8.data._M_elems[10] = 0;
          local_3e8.data._M_elems[0xb] = 0;
          local_3e8.data._M_elems[0xc] = 0;
          local_3e8.data._M_elems[0xd] = 0;
          local_3e8.data._M_elems[0xe] = 0;
          local_3e8.data._M_elems[0xf] = 0;
          local_3e8.data._M_elems[0x10] = 0;
          local_3e8.data._M_elems[0x11] = 0;
          local_3e8.data._M_elems[0x12] = 0;
          local_3e8.data._M_elems[0x13] = 0;
          local_3e8.data._M_elems[0x14] = 0;
          local_3e8.data._M_elems[0x15] = 0;
          local_3e8.data._M_elems[0x16] = 0;
          local_3e8.data._M_elems[0x17] = 0;
          local_3e8.data._M_elems[0x18] = 0;
          local_3e8.data._M_elems[0x19] = 0;
          local_3e8.data._M_elems._104_5_ = 0;
          local_3e8.data._M_elems[0x1b]._1_3_ = 0;
          local_3e8.exp = 0;
          local_3e8.neg = false;
          pcVar17 = &local_2a8;
          if (&local_3e8 != pcVar15) {
            pcVar20 = &local_3e8;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar23 * -8 + 4);
            }
            local_3e8.exp = local_498.exp;
            local_3e8.neg = local_498.neg;
            local_3e8.fpclass = local_498.fpclass;
            local_3e8.prec_elem = local_498.prec_elem;
            pcVar17 = pcVar15;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_3e8,pcVar17);
          pcVar15 = &local_3f8[iVar8].m_backend;
          local_1b0 = (pointer)0x1c00000000;
          local_228._0_4_ = 0;
          local_228._4_4_ = 0;
          local_228._8_4_ = 0;
          local_228._12_4_ = 0;
          local_228._16_4_ = 0;
          local_228._20_4_ = 0;
          local_228._24_4_ = 0;
          local_228._28_4_ = 0;
          local_228._32_4_ = 0;
          local_228._36_4_ = 0;
          local_228._40_4_ = 0;
          local_228._44_4_ = 0;
          local_228._48_4_ = 0;
          local_228._52_4_ = 0;
          local_228._56_4_ = 0;
          local_228._60_4_ = 0;
          local_228._64_4_ = 0;
          local_228._68_4_ = 0;
          local_228._72_4_ = 0;
          local_228._76_4_ = 0;
          local_228._80_4_ = 0;
          local_228._84_4_ = 0;
          local_228._88_4_ = 0;
          local_228._92_4_ = 0;
          local_228._96_4_ = 0;
          local_228._100_4_ = 0;
          local_228._104_5_ = 0;
          local_228._109_3_ = 0;
          local_228._112_4_ = 0;
          local_228[0x74] = false;
          local_498.fpclass = cpp_dec_float_finite;
          local_498.prec_elem = 0x1c;
          local_498.data._M_elems[0] = 0;
          local_498.data._M_elems[1] = 0;
          local_498.data._M_elems[2] = 0;
          local_498.data._M_elems[3] = 0;
          local_498.data._M_elems[4] = 0;
          local_498.data._M_elems[5] = 0;
          local_498.data._M_elems[6] = 0;
          local_498.data._M_elems[7] = 0;
          local_498.data._M_elems[8] = 0;
          local_498.data._M_elems[9] = 0;
          local_498.data._M_elems[10] = 0;
          local_498.data._M_elems[0xb] = 0;
          local_498.data._M_elems[0xc] = 0;
          local_498.data._M_elems[0xd] = 0;
          local_498.data._M_elems[0xe] = 0;
          local_498.data._M_elems[0xf] = 0;
          local_498.data._M_elems[0x10] = 0;
          local_498.data._M_elems[0x11] = 0;
          local_498.data._M_elems[0x12] = 0;
          local_498.data._M_elems[0x13] = 0;
          local_498.data._M_elems[0x14] = 0;
          local_498.data._M_elems[0x15] = 0;
          local_498.data._M_elems[0x16] = 0;
          local_498.data._M_elems[0x17] = 0;
          local_498.data._M_elems[0x18] = 0;
          local_498.data._M_elems[0x19] = 0;
          local_498.data._M_elems._104_5_ = 0;
          local_498.data._M_elems[0x1b]._1_3_ = 0;
          local_498.exp = 0;
          local_498.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_498,2.0);
          if ((cpp_dec_float<200U,_int,_void> *)local_228 != pcVar15) {
            pcVar17 = pcVar15;
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_228;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar23 * -8 + 4);
            }
            local_228._112_4_ = pcVar15->exp;
            local_228[0x74] = pcVar15->neg;
            local_1b0 = *(pointer *)&pcVar15->fpclass;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_228,&local_498);
          pcVar15 = &local_3e8;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_358;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar23 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
          }
          local_358._112_4_ = local_3e8.exp;
          local_358[0x74] = local_3e8.neg;
          local_358._120_4_ = local_3e8.fpclass;
          local_358._124_4_ = local_3e8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_358,
                     (cpp_dec_float<200U,_int,_void> *)local_228);
          pcVar15 = &local_2a8;
          pcVar17 = &local_498;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *(uint *)pcVar17 = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar23 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar17 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_498.exp = local_2a8.exp;
          local_498.neg = local_2a8.neg;
          local_498.fpclass = local_2a8.fpclass;
          local_498.prec_elem = local_2a8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_498,(cpp_dec_float<200U,_int,_void> *)local_358);
          uVar7 = local_358._128_8_;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)(local_358._128_8_ + (long)iVar8 * 0x80);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (pcVar17,&local_498);
          if ((((((pointer)(uVar7 + (long)iVar8 * 0x80))->m_backend).fpclass == cpp_dec_float_NaN)
              || (local_1a8.fpclass == cpp_dec_float_NaN)) ||
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar17,&local_1a8), -1 < iVar8)) {
            ::soplex::infinity::__tls_init();
            local_498.fpclass = cpp_dec_float_finite;
            local_498.prec_elem = 0x1c;
            local_498.data._M_elems[0] = 0;
            local_498.data._M_elems[1] = 0;
            local_498.data._M_elems[2] = 0;
            local_498.data._M_elems[3] = 0;
            local_498.data._M_elems[4] = 0;
            local_498.data._M_elems[5] = 0;
            local_498.data._M_elems[6] = 0;
            local_498.data._M_elems[7] = 0;
            local_498.data._M_elems[8] = 0;
            local_498.data._M_elems[9] = 0;
            local_498.data._M_elems[10] = 0;
            local_498.data._M_elems[0xb] = 0;
            local_498.data._M_elems[0xc] = 0;
            local_498.data._M_elems[0xd] = 0;
            local_498.data._M_elems[0xe] = 0;
            local_498.data._M_elems[0xf] = 0;
            local_498.data._M_elems[0x10] = 0;
            local_498.data._M_elems[0x11] = 0;
            local_498.data._M_elems[0x12] = 0;
            local_498.data._M_elems[0x13] = 0;
            local_498.data._M_elems[0x14] = 0;
            local_498.data._M_elems[0x15] = 0;
            local_498.data._M_elems[0x16] = 0;
            local_498.data._M_elems[0x17] = 0;
            local_498.data._M_elems[0x18] = 0;
            local_498.data._M_elems[0x19] = 0;
            local_498.data._M_elems._104_5_ = 0;
            local_498.data._M_elems[0x1b]._1_3_ = 0;
            local_498.exp = 0;
            local_498.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_498,local_2c0);
            pcVar15 = local_410;
            if (((pcVar17->fpclass != cpp_dec_float_NaN) && (local_498.fpclass != cpp_dec_float_NaN)
                ) && (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(pcVar17,&local_498), 0 < iVar8)) {
              RVar6 = Tolerances::epsilon((((this->
                                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).thesolver)->
                                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          )._tolerances.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr);
              local_3e8.fpclass = cpp_dec_float_finite;
              local_3e8.prec_elem = 0x1c;
              local_3e8.data._M_elems[0] = 0;
              local_3e8.data._M_elems[1] = 0;
              local_3e8.data._M_elems[2] = 0;
              local_3e8.data._M_elems[3] = 0;
              local_3e8.data._M_elems[4] = 0;
              local_3e8.data._M_elems[5] = 0;
              local_3e8.data._M_elems[6] = 0;
              local_3e8.data._M_elems[7] = 0;
              local_3e8.data._M_elems[8] = 0;
              local_3e8.data._M_elems[9] = 0;
              local_3e8.data._M_elems[10] = 0;
              local_3e8.data._M_elems[0xb] = 0;
              local_3e8.data._M_elems[0xc] = 0;
              local_3e8.data._M_elems[0xd] = 0;
              local_3e8.data._M_elems[0xe] = 0;
              local_3e8.data._M_elems[0xf] = 0;
              local_3e8.data._M_elems[0x10] = 0;
              local_3e8.data._M_elems[0x11] = 0;
              local_3e8.data._M_elems[0x12] = 0;
              local_3e8.data._M_elems[0x13] = 0;
              local_3e8.data._M_elems[0x14] = 0;
              local_3e8.data._M_elems[0x15] = 0;
              local_3e8.data._M_elems[0x16] = 0;
              local_3e8.data._M_elems[0x17] = 0;
              local_3e8.data._M_elems[0x18] = 0;
              local_3e8.data._M_elems[0x19] = 0;
              local_3e8.data._M_elems._104_5_ = 0;
              local_3e8.data._M_elems[0x1b]._1_3_ = 0;
              local_3e8.exp = 0;
              local_3e8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_3e8,RVar6);
              local_358._120_4_ = cpp_dec_float_finite;
              local_358._124_4_ = 0x1c;
              local_358._0_4_ = 0;
              local_358._4_4_ = 0;
              local_358._8_4_ = 0;
              local_358._12_4_ = 0;
              local_358._16_4_ = 0;
              local_358._20_4_ = 0;
              local_358._24_4_ = 0;
              local_358._28_4_ = 0;
              local_358._32_4_ = 0;
              local_358._36_4_ = 0;
              local_358._40_4_ = 0;
              local_358._44_4_ = 0;
              local_358._48_4_ = 0;
              local_358._52_4_ = 0;
              local_358._56_4_ = 0;
              local_358._60_4_ = 0;
              local_358._64_4_ = 0;
              local_358._68_4_ = 0;
              local_358._72_4_ = 0;
              local_358._76_4_ = 0;
              local_358._80_4_ = 0;
              local_358._84_4_ = 0;
              local_358._88_4_ = 0;
              local_358._92_4_ = 0;
              local_358._96_4_ = 0;
              local_358._100_4_ = 0;
              local_358._104_5_ = 0;
              local_358._109_3_ = 0;
              local_358._112_4_ = 0;
              local_358[0x74] = false;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_498,1,(type *)0x0);
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)local_358,&local_498,&local_3e8);
              puVar12 = (uint *)local_358;
              pcVar20 = pcVar17;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar20->data)._M_elems[0] = *puVar12;
                puVar12 = puVar12 + (ulong)bVar23 * 0xfffffffffffffffe + 1;
                pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar23 * -8 + 4)
                ;
              }
              pcVar17->exp = local_358._112_4_;
              pcVar17->neg = local_358[0x74];
              pcVar17->fpclass = local_358._120_4_;
              pcVar17->prec_elem = local_358._124_4_;
            }
          }
          else {
            pcVar15 = &local_1a8;
            pcVar20 = pcVar17;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar23 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar23 * -8 + 4);
            }
            pcVar17->exp = local_1a8.exp;
            pcVar17->neg = local_1a8.neg;
            pcVar17->fpclass = local_1a8.fpclass;
            pcVar17->prec_elem = local_1a8.prec_elem;
            pcVar15 = local_410;
          }
          local_3f0 = local_3f0 - 1;
        } while (1 < local_3f0);
      }
      lVar9 = (long)(local_360->thedelta).super_IdxSet.num;
      if (0 < lVar9) {
        local_400 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&this->pi_p;
        local_410 = (cpp_dec_float<200U,_int,_void> *)*(double *)(in_FS_OFFSET + -8);
        local_408 = this;
        do {
          local_3f0 = lVar9;
          lVar9 = (long)(local_360->thedelta).super_IdxSet.idx[lVar9 + -1];
          local_3f8 = (pointer)(lVar9 * 0x80);
          pcVar17 = &local_2b8[lVar9].m_backend;
          local_498.fpclass = cpp_dec_float_finite;
          local_498.prec_elem = 0x1c;
          local_498.data._M_elems[0] = 0;
          local_498.data._M_elems[1] = 0;
          local_498.data._M_elems[2] = 0;
          local_498.data._M_elems[3] = 0;
          local_498.data._M_elems[4] = 0;
          local_498.data._M_elems[5] = 0;
          local_498.data._M_elems[6] = 0;
          local_498.data._M_elems[7] = 0;
          local_498.data._M_elems[8] = 0;
          local_498.data._M_elems[9] = 0;
          local_498.data._M_elems[10] = 0;
          local_498.data._M_elems[0xb] = 0;
          local_498.data._M_elems[0xc] = 0;
          local_498.data._M_elems[0xd] = 0;
          local_498.data._M_elems[0xe] = 0;
          local_498.data._M_elems[0xf] = 0;
          local_498.data._M_elems[0x10] = 0;
          local_498.data._M_elems[0x11] = 0;
          local_498.data._M_elems[0x12] = 0;
          local_498.data._M_elems[0x13] = 0;
          local_498.data._M_elems[0x14] = 0;
          local_498.data._M_elems[0x15] = 0;
          local_498.data._M_elems[0x16] = 0;
          local_498.data._M_elems[0x17] = 0;
          local_498.data._M_elems[0x18] = 0;
          local_498.data._M_elems[0x19] = 0;
          local_498.data._M_elems._104_5_ = 0;
          local_498.data._M_elems[0x1b]._1_3_ = 0;
          local_498.exp = 0;
          local_498.neg = false;
          pcVar15 = &local_128;
          if (&local_498 != pcVar17) {
            pcVar20 = &local_498;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              *(uint *)pcVar20 = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar23 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar20 + ((ulong)bVar23 * -2 + 1) * 4);
            }
            local_498.exp = local_128.exp;
            local_498.neg = local_128.neg;
            local_498.fpclass = local_128.fpclass;
            local_498.prec_elem = local_128.prec_elem;
            pcVar15 = pcVar17;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_498,pcVar15);
          pcVar15 = &local_498;
          pcVar17 = &local_2a8;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pcVar17->data)._M_elems[0] = *(uint *)pcVar15;
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar15 + ((ulong)bVar23 * -2 + 1) * 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
          }
          local_2a8.exp = local_498.exp;
          local_2a8.neg = local_498.neg;
          local_2a8.fpclass = local_498.fpclass;
          local_2a8.prec_elem = local_498.prec_elem;
          local_3e8.fpclass = cpp_dec_float_finite;
          local_3e8.prec_elem = 0x1c;
          local_3e8.data._M_elems[0] = 0;
          local_3e8.data._M_elems[1] = 0;
          local_3e8.data._M_elems[2] = 0;
          local_3e8.data._M_elems[3] = 0;
          local_3e8.data._M_elems[4] = 0;
          local_3e8.data._M_elems[5] = 0;
          local_3e8.data._M_elems[6] = 0;
          local_3e8.data._M_elems[7] = 0;
          local_3e8.data._M_elems[8] = 0;
          local_3e8.data._M_elems[9] = 0;
          local_3e8.data._M_elems[10] = 0;
          local_3e8.data._M_elems[0xb] = 0;
          local_3e8.data._M_elems[0xc] = 0;
          local_3e8.data._M_elems[0xd] = 0;
          local_3e8.data._M_elems[0xe] = 0;
          local_3e8.data._M_elems[0xf] = 0;
          local_3e8.data._M_elems[0x10] = 0;
          local_3e8.data._M_elems[0x11] = 0;
          local_3e8.data._M_elems[0x12] = 0;
          local_3e8.data._M_elems[0x13] = 0;
          local_3e8.data._M_elems[0x14] = 0;
          local_3e8.data._M_elems[0x15] = 0;
          local_3e8.data._M_elems[0x16] = 0;
          local_3e8.data._M_elems[0x17] = 0;
          local_3e8.data._M_elems[0x18] = 0;
          local_3e8.data._M_elems[0x19] = 0;
          local_3e8.data._M_elems._104_5_ = 0;
          local_3e8.data._M_elems[0x1b]._1_3_ = 0;
          local_3e8.exp = 0;
          local_3e8.neg = false;
          pUVar13 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&local_2a8;
          if ((UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&local_3e8 != local_400) {
            pcVar15 = &local_2a8;
            pcVar17 = &local_3e8;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar23 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
            }
            local_3e8.exp = local_498.exp;
            local_3e8.neg = local_498.neg;
            local_3e8.fpclass = local_498.fpclass;
            local_3e8.prec_elem = local_498.prec_elem;
            pUVar13 = local_400;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_3e8,(cpp_dec_float<200U,_int,_void> *)pUVar13);
          pSVar4 = ((this->
                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->thevectors;
          pIVar5 = (pSVar4->set).theitem;
          iVar8 = (pSVar4->set).thekey[lVar9].idx;
          local_498.fpclass = cpp_dec_float_finite;
          local_498.prec_elem = 0x1c;
          local_498.data._M_elems[0] = 0;
          local_498.data._M_elems[1] = 0;
          local_498.data._M_elems[2] = 0;
          local_498.data._M_elems[3] = 0;
          local_498.data._M_elems[4] = 0;
          local_498.data._M_elems[5] = 0;
          local_498.data._M_elems[6] = 0;
          local_498.data._M_elems[7] = 0;
          local_498.data._M_elems[8] = 0;
          local_498.data._M_elems[9] = 0;
          local_498.data._M_elems[10] = 0;
          local_498.data._M_elems[0xb] = 0;
          local_498.data._M_elems[0xc] = 0;
          local_498.data._M_elems[0xd] = 0;
          local_498.data._M_elems[0xe] = 0;
          local_498.data._M_elems[0xf] = 0;
          local_498.data._M_elems[0x10] = 0;
          local_498.data._M_elems[0x11] = 0;
          local_498.data._M_elems[0x12] = 0;
          local_498.data._M_elems[0x13] = 0;
          local_498.data._M_elems[0x14] = 0;
          local_498.data._M_elems[0x15] = 0;
          local_498.data._M_elems[0x16] = 0;
          local_498.data._M_elems[0x17] = 0;
          local_498.data._M_elems[0x18] = 0;
          local_498.data._M_elems[0x19] = 0;
          local_498.data._M_elems._104_5_ = 0;
          local_498.data._M_elems[0x1b]._1_3_ = 0;
          local_498.exp = 0;
          local_498.neg = false;
          iVar1 = pIVar5[iVar8].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused;
          if (iVar1 < 1) {
            uVar22 = 0;
            iVar8 = 0;
            fVar24 = cpp_dec_float_finite;
            iVar25 = 0x1c;
          }
          else {
            pNVar16 = pIVar5[iVar8].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            uVar21 = iVar1 + 1;
            do {
              pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((this->workVec).
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + pNVar16->idx);
              local_358._120_4_ = cpp_dec_float_finite;
              local_358._124_4_ = 0x1c;
              local_358._0_4_ = 0;
              local_358._4_4_ = 0;
              local_358._8_4_ = 0;
              local_358._12_4_ = 0;
              local_358._16_4_ = 0;
              local_358._20_4_ = 0;
              local_358._24_4_ = 0;
              local_358._28_4_ = 0;
              local_358._32_4_ = 0;
              local_358._36_4_ = 0;
              local_358._40_4_ = 0;
              local_358._44_4_ = 0;
              local_358._48_4_ = 0;
              local_358._52_4_ = 0;
              local_358._56_4_ = 0;
              local_358._60_4_ = 0;
              local_358._64_4_ = 0;
              local_358._68_4_ = 0;
              local_358._72_4_ = 0;
              local_358._76_4_ = 0;
              local_358._80_4_ = 0;
              local_358._84_4_ = 0;
              local_358._88_4_ = 0;
              local_358._92_4_ = 0;
              local_358._96_4_ = 0;
              local_358._100_4_ = 0;
              local_358._104_5_ = 0;
              local_358._109_3_ = 0;
              local_358._112_4_ = 0;
              local_358[0x74] = false;
              v = pNVar16;
              if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)local_358 != pNVar14) &&
                 (v = pNVar14,
                 pNVar16 !=
                 (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_358)) {
                pNVar14 = pNVar16;
                pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)local_358;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pNVar19->val).m_backend.data._M_elems[0] =
                       (pNVar14->val).m_backend.data._M_elems[0];
                  pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)pNVar14 + (ulong)bVar23 * -8 + 4);
                  pNVar19 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)pNVar19 + (ulong)bVar23 * -8 + 4);
                }
                local_358._112_4_ = (pNVar16->val).m_backend.exp;
                local_358[0x74] = (pNVar16->val).m_backend.neg;
                local_358._120_4_ = (pNVar16->val).m_backend.fpclass;
                local_358._124_4_ = (pNVar16->val).m_backend.prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_358,
                         (cpp_dec_float<200U,_int,_void> *)v);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&local_498,(cpp_dec_float<200U,_int,_void> *)local_358);
              pNVar16 = pNVar16 + 1;
              uVar21 = uVar21 - 1;
            } while (1 < uVar21);
            fVar24 = local_498.fpclass;
            iVar25 = local_498.prec_elem;
            iVar8 = local_498.exp;
            uVar22 = local_498.neg;
          }
          local_358._128_8_ = (pointer)CONCAT44(iVar25,fVar24);
          uStack_2d0 = 0;
          pcVar15 = &local_498;
          puVar12 = local_a0;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar12 = *(uint *)pcVar15;
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar15 + ((ulong)bVar23 * -2 + 1) * 4);
            puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
          }
          local_1b0 = (pointer)0x1c00000000;
          local_228._0_4_ = 0;
          local_228._4_4_ = 0;
          local_228._8_4_ = 0;
          local_228._12_4_ = 0;
          local_228._16_4_ = 0;
          local_228._20_4_ = 0;
          local_228._24_4_ = 0;
          local_228._28_4_ = 0;
          local_228._32_4_ = 0;
          local_228._36_4_ = 0;
          local_228._40_4_ = 0;
          local_228._44_4_ = 0;
          local_228._48_4_ = 0;
          local_228._52_4_ = 0;
          local_228._56_4_ = 0;
          local_228._60_4_ = 0;
          local_228._64_4_ = 0;
          local_228._68_4_ = 0;
          local_228._72_4_ = 0;
          local_228._76_4_ = 0;
          local_228._80_4_ = 0;
          local_228._84_4_ = 0;
          local_228._88_4_ = 0;
          local_228._92_4_ = 0;
          local_228._96_4_ = 0;
          local_228._100_4_ = 0;
          local_228._104_5_ = 0;
          local_228._109_3_ = 0;
          local_228._112_4_ = 0;
          local_228[0x74] = false;
          local_498.fpclass = cpp_dec_float_finite;
          local_498.prec_elem = 0x1c;
          local_498.data._M_elems[0] = 0;
          local_498.data._M_elems[1] = 0;
          local_498.data._M_elems[2] = 0;
          local_498.data._M_elems[3] = 0;
          local_498.data._M_elems[4] = 0;
          local_498.data._M_elems[5] = 0;
          local_498.data._M_elems[6] = 0;
          local_498.data._M_elems[7] = 0;
          local_498.data._M_elems[8] = 0;
          local_498.data._M_elems[9] = 0;
          local_498.data._M_elems[10] = 0;
          local_498.data._M_elems[0xb] = 0;
          local_498.data._M_elems[0xc] = 0;
          local_498.data._M_elems[0xd] = 0;
          local_498.data._M_elems[0xe] = 0;
          local_498.data._M_elems[0xf] = 0;
          local_498.data._M_elems[0x10] = 0;
          local_498.data._M_elems[0x11] = 0;
          local_498.data._M_elems[0x12] = 0;
          local_498.data._M_elems[0x13] = 0;
          local_498.data._M_elems[0x14] = 0;
          local_498.data._M_elems[0x15] = 0;
          local_498.data._M_elems[0x16] = 0;
          local_498.data._M_elems[0x17] = 0;
          local_498.data._M_elems[0x18] = 0;
          local_498.data._M_elems[0x19] = 0;
          local_498.data._M_elems._104_5_ = 0;
          local_498.data._M_elems[0x1b]._1_3_ = 0;
          local_498.exp = 0;
          local_498.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_498,2.0);
          puVar12 = local_a0;
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_228;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar15->data)._M_elems[0] = *puVar12;
            puVar12 = puVar12 + (ulong)bVar23 * -2 + 1;
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar23 * -8 + 4);
          }
          local_1b0 = (pointer)local_358._128_8_;
          local_228._112_4_ = iVar8;
          local_228[0x74] = uVar22;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_228,&local_498);
          pcVar15 = &local_3e8;
          pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)local_358;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pNVar16->val).m_backend.data._M_elems[0] = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar23 * -8 + 4);
            pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pNVar16 + (ulong)bVar23 * -8 + 4);
          }
          local_358._112_4_ = local_3e8.exp;
          local_358[0x74] = local_3e8.neg;
          local_358._120_4_ = local_3e8.fpclass;
          local_358._124_4_ = local_3e8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_358,
                     (cpp_dec_float<200U,_int,_void> *)local_228);
          pcVar15 = &local_2a8;
          pcVar17 = &local_498;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *(uint *)pcVar17 = (pcVar15->data)._M_elems[0];
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar23 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar17 + ((ulong)bVar23 * -2 + 1) * 4);
          }
          local_498.exp = local_2a8.exp;
          local_498.neg = local_2a8.neg;
          local_498.fpclass = local_2a8.fpclass;
          local_498.prec_elem = local_2a8.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_498,(cpp_dec_float<200U,_int,_void> *)local_358);
          pnVar11 = local_2b0;
          pnVar3 = local_3f8;
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(local_2b0->m_backend).data + (long)local_3f8);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (pcVar15,&local_498);
          if (((*(int *)((long)&(pnVar11->m_backend).data + (long)pnVar3 + 0x78) == 2) ||
              (local_1a8.fpclass == cpp_dec_float_NaN)) ||
             (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar15,&local_1a8), -1 < iVar8)) {
            ::soplex::infinity::__tls_init();
            local_498.fpclass = cpp_dec_float_finite;
            local_498.prec_elem = 0x1c;
            local_498.data._M_elems[0] = 0;
            local_498.data._M_elems[1] = 0;
            local_498.data._M_elems[2] = 0;
            local_498.data._M_elems[3] = 0;
            local_498.data._M_elems[4] = 0;
            local_498.data._M_elems[5] = 0;
            local_498.data._M_elems[6] = 0;
            local_498.data._M_elems[7] = 0;
            local_498.data._M_elems[8] = 0;
            local_498.data._M_elems[9] = 0;
            local_498.data._M_elems[10] = 0;
            local_498.data._M_elems[0xb] = 0;
            local_498.data._M_elems[0xc] = 0;
            local_498.data._M_elems[0xd] = 0;
            local_498.data._M_elems[0xe] = 0;
            local_498.data._M_elems[0xf] = 0;
            local_498.data._M_elems[0x10] = 0;
            local_498.data._M_elems[0x11] = 0;
            local_498.data._M_elems[0x12] = 0;
            local_498.data._M_elems[0x13] = 0;
            local_498.data._M_elems[0x14] = 0;
            local_498.data._M_elems[0x15] = 0;
            local_498.data._M_elems[0x16] = 0;
            local_498.data._M_elems[0x17] = 0;
            local_498.data._M_elems[0x18] = 0;
            local_498.data._M_elems[0x19] = 0;
            local_498.data._M_elems._104_5_ = 0;
            local_498.data._M_elems[0x1b]._1_3_ = 0;
            local_498.exp = 0;
            local_498.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_498,(double)local_410);
            this = local_408;
            if (((pcVar15->fpclass != cpp_dec_float_NaN) && (local_498.fpclass != cpp_dec_float_NaN)
                ) && (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare(pcVar15,&local_498), 0 < iVar8)) {
              RVar6 = Tolerances::epsilon((((this->
                                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).thesolver)->
                                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          )._tolerances.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr);
              local_3e8.fpclass = cpp_dec_float_finite;
              local_3e8.prec_elem = 0x1c;
              local_3e8.data._M_elems[0] = 0;
              local_3e8.data._M_elems[1] = 0;
              local_3e8.data._M_elems[2] = 0;
              local_3e8.data._M_elems[3] = 0;
              local_3e8.data._M_elems[4] = 0;
              local_3e8.data._M_elems[5] = 0;
              local_3e8.data._M_elems[6] = 0;
              local_3e8.data._M_elems[7] = 0;
              local_3e8.data._M_elems[8] = 0;
              local_3e8.data._M_elems[9] = 0;
              local_3e8.data._M_elems[10] = 0;
              local_3e8.data._M_elems[0xb] = 0;
              local_3e8.data._M_elems[0xc] = 0;
              local_3e8.data._M_elems[0xd] = 0;
              local_3e8.data._M_elems[0xe] = 0;
              local_3e8.data._M_elems[0xf] = 0;
              local_3e8.data._M_elems[0x10] = 0;
              local_3e8.data._M_elems[0x11] = 0;
              local_3e8.data._M_elems[0x12] = 0;
              local_3e8.data._M_elems[0x13] = 0;
              local_3e8.data._M_elems[0x14] = 0;
              local_3e8.data._M_elems[0x15] = 0;
              local_3e8.data._M_elems[0x16] = 0;
              local_3e8.data._M_elems[0x17] = 0;
              local_3e8.data._M_elems[0x18] = 0;
              local_3e8.data._M_elems[0x19] = 0;
              local_3e8.data._M_elems._104_5_ = 0;
              local_3e8.data._M_elems[0x1b]._1_3_ = 0;
              local_3e8.exp = 0;
              local_3e8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_3e8,RVar6);
              local_358._120_4_ = cpp_dec_float_finite;
              local_358._124_4_ = 0x1c;
              local_358._0_4_ = 0;
              local_358._4_4_ = 0;
              local_358._8_4_ = 0;
              local_358._12_4_ = 0;
              local_358._16_4_ = 0;
              local_358._20_4_ = 0;
              local_358._24_4_ = 0;
              local_358._28_4_ = 0;
              local_358._32_4_ = 0;
              local_358._36_4_ = 0;
              local_358._40_4_ = 0;
              local_358._44_4_ = 0;
              local_358._48_4_ = 0;
              local_358._52_4_ = 0;
              local_358._56_4_ = 0;
              local_358._60_4_ = 0;
              local_358._64_4_ = 0;
              local_358._68_4_ = 0;
              local_358._72_4_ = 0;
              local_358._76_4_ = 0;
              local_358._80_4_ = 0;
              local_358._84_4_ = 0;
              local_358._88_4_ = 0;
              local_358._92_4_ = 0;
              local_358._96_4_ = 0;
              local_358._100_4_ = 0;
              local_358._104_5_ = 0;
              local_358._109_3_ = 0;
              local_358._112_4_ = 0;
              local_358[0x74] = false;
              local_498.fpclass = cpp_dec_float_finite;
              local_498.prec_elem = 0x1c;
              local_498.data._M_elems[0] = 0;
              local_498.data._M_elems[1] = 0;
              local_498.data._M_elems[2] = 0;
              local_498.data._M_elems[3] = 0;
              local_498.data._M_elems[4] = 0;
              local_498.data._M_elems[5] = 0;
              local_498.data._M_elems[6] = 0;
              local_498.data._M_elems[7] = 0;
              local_498.data._M_elems[8] = 0;
              local_498.data._M_elems[9] = 0;
              local_498.data._M_elems[10] = 0;
              local_498.data._M_elems[0xb] = 0;
              local_498.data._M_elems[0xc] = 0;
              local_498.data._M_elems[0xd] = 0;
              local_498.data._M_elems[0xe] = 0;
              local_498.data._M_elems[0xf] = 0;
              local_498.data._M_elems[0x10] = 0;
              local_498.data._M_elems[0x11] = 0;
              local_498.data._M_elems[0x12] = 0;
              local_498.data._M_elems[0x13] = 0;
              local_498.data._M_elems[0x14] = 0;
              local_498.data._M_elems[0x15] = 0;
              local_498.data._M_elems[0x16] = 0;
              local_498.data._M_elems[0x17] = 0;
              local_498.data._M_elems[0x18] = 0;
              local_498.data._M_elems[0x19] = 0;
              local_498.data._M_elems._104_5_ = 0;
              local_498.data._M_elems[0x1b]._1_3_ = 0;
              local_498.exp = 0;
              local_498.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_498,1.0);
              boost::multiprecision::default_ops::
              eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        ((cpp_dec_float<200U,_int,_void> *)local_358,&local_498,&local_3e8);
              pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_358;
              pcVar17 = pcVar15;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar17->data)._M_elems[0] = (pNVar16->val).m_backend.data._M_elems[0];
                pNVar16 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)pNVar16 + (ulong)bVar23 * -8 + 4);
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4)
                ;
              }
              pcVar15->exp = local_358._112_4_;
              pcVar15->neg = local_358[0x74];
              pcVar15->fpclass = local_358._120_4_;
              pcVar15->prec_elem = local_358._124_4_;
            }
          }
          else {
            pcVar17 = &local_1a8;
            pcVar20 = pcVar15;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar20->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar23 * -8 + 4);
              pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar23 * -8 + 4);
            }
            pcVar15->exp = local_1a8.exp;
            pcVar15->neg = local_1a8.neg;
            pcVar15->fpclass = local_1a8.fpclass;
            pcVar15->prec_elem = local_1a8.prec_elem;
            this = local_408;
          }
          lVar9 = local_3f0 + -1;
        } while (1 < (long)local_3f0);
      }
    }
  }
  return;
}

Assistant:

void SPxSteepPR<R>::entered4(SPxId /* id */, int n)
{
   assert(this->thesolver->type() == SPxSolverBase<R>::ENTER);

   if(n >= 0 && n < this->thesolver->dim())
   {
      R delta = 2 + 1.0 / this->thesolver->basis().iteration();
      R* coWeights_ptr = this->thesolver->coWeights.get_ptr();
      R* weights_ptr = this->thesolver->weights.get_ptr();
      const R* workVec_ptr = workVec.get_const_ptr();
      const R* pVec = this->thesolver->pVec().delta().values();
      const IdxSet& pIdx = this->thesolver->pVec().idx();
      const R* coPvec = this->thesolver->coPvec().delta().values();
      const IdxSet& coPidx = this->thesolver->coPvec().idx();
      R xi_p = 1 / this->thesolver->fVec().delta()[n];
      int i, j;
      R xi_ip;

      assert(this->thesolver->fVec().delta()[n] > this->thesolver->epsilon()
             || this->thesolver->fVec().delta()[n] < -this->thesolver->epsilon());

      for(j = coPidx.size() - 1; j >= 0; --j)
      {
         i = coPidx.index(j);
         xi_ip = xi_p * coPvec[i];
         coWeights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * workVec_ptr[i]);

         /*
           if(coWeights_ptr[i] < 1)
           coWeights_ptr[i] = 1 / (2-x);
         */
         if(coWeights_ptr[i] < delta)
            coWeights_ptr[i] = delta;
         // coWeights_ptr[i] = 1;
         else if(coWeights_ptr[i] > R(infinity))
            coWeights_ptr[i] = 1 / this->thesolver->epsilon();
      }

      for(j = pIdx.size() - 1; j >= 0; --j)
      {
         i = pIdx.index(j);
         xi_ip = xi_p * pVec[i];
         weights_ptr[i] += xi_ip * (xi_ip * pi_p - 2.0 * (this->thesolver->vector(i) * workVec));

         /*
           if(weights_ptr[i] < 1)
           weights_ptr[i] = 1 / (2-x);
         */
         if(weights_ptr[i] < delta)
            weights_ptr[i] = delta;
         // weights_ptr[i] = 1;
         else if(weights_ptr[i] > R(infinity))
            weights_ptr[i] = 1.0 / this->thesolver->epsilon();
      }
   }

   /*@
     if(this->thesolver->isId(id))
     weights[   this->thesolver->number(id) ] *= 1.0001;
     else if(this->thesolver->isCoId(id))
     coWeights[ this->thesolver->number(id) ] *= 1.0001;
   */

}